

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_connect_init_proxy(connectdata *conn,int sockindex)

{
  ssl_backend_data *__s;
  undefined3 uVar1;
  ssl_connection_state sVar2;
  undefined4 uVar3;
  ssl_connect_data *psVar4;
  ssl_connect_data *psVar5;
  ssl_backend_data *pbdata;
  int sockindex_local;
  connectdata *conn_local;
  
  if ((conn->ssl[sockindex].state == ssl_connection_complete) &&
     ((conn->proxy_ssl[sockindex].use & 1U) == 0)) {
    if ((Curl_ssl->supports & 0x10) == 0) {
      return CURLE_NOT_BUILT_IN;
    }
    __s = conn->proxy_ssl[sockindex].backend;
    psVar4 = conn->proxy_ssl + sockindex;
    psVar5 = conn->ssl + sockindex;
    uVar1 = *(undefined3 *)&psVar5->field_0x1;
    sVar2 = psVar5->state;
    psVar4->use = psVar5->use;
    *(undefined3 *)&psVar4->field_0x1 = uVar1;
    psVar4->state = sVar2;
    uVar3 = *(undefined4 *)&psVar5->field_0xc;
    psVar4->connecting_state = psVar5->connecting_state;
    *(undefined4 *)&psVar4->field_0xc = uVar3;
    psVar4->backend = psVar5->backend;
    memset(conn->ssl + sockindex,0,0x18);
    memset(__s,0,Curl_ssl->sizeof_ssl_backend_data);
    conn->ssl[sockindex].backend = __s;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
ssl_connect_init_proxy(struct connectdata *conn, int sockindex)
{
  DEBUGASSERT(conn->bits.proxy_ssl_connected[sockindex]);
  if(ssl_connection_complete == conn->ssl[sockindex].state &&
     !conn->proxy_ssl[sockindex].use) {
    struct ssl_backend_data *pbdata;

    if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
      return CURLE_NOT_BUILT_IN;

    /* The pointers to the ssl backend data, which is opaque here, are swapped
       rather than move the contents. */
    pbdata = conn->proxy_ssl[sockindex].backend;
    conn->proxy_ssl[sockindex] = conn->ssl[sockindex];

    memset(&conn->ssl[sockindex], 0, sizeof(conn->ssl[sockindex]));
    memset(pbdata, 0, Curl_ssl->sizeof_ssl_backend_data);

    conn->ssl[sockindex].backend = pbdata;
  }
  return CURLE_OK;
}